

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void Cmd_map(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (netgame) {
    pcVar4 = "Use \x1c+changemap\x1c- instead. \x1c+Map\x1c- is for single-player only.\n";
LAB_003a53a3:
    Printf(pcVar4);
    return;
  }
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    pcVar4 = "Usage: map <map name> [coop|dm]\n";
    goto LAB_003a53a3;
  }
  iVar2 = 1;
  pcVar4 = FCommandLine::operator[](argv,1);
  bVar1 = P_CheckMapData(pcVar4);
  if (!bVar1) {
    pcVar4 = FCommandLine::operator[](argv,1);
    Printf("No map %s\n",pcVar4);
    return;
  }
  iVar3 = FCommandLine::argc(argv);
  if (iVar3 < 3) {
LAB_003a536f:
    iVar3 = FCommandLine::argc(argv);
    if (iVar3 < 3) goto LAB_003a53e8;
    pcVar4 = FCommandLine::operator[](argv,2);
    iVar3 = strcasecmp(pcVar4,"dm");
    if (iVar3 != 0) goto LAB_003a53e8;
  }
  else {
    pcVar4 = FCommandLine::operator[](argv,2);
    iVar3 = strcasecmp(pcVar4,"coop");
    if (iVar3 != 0) goto LAB_003a536f;
    iVar2 = 0;
  }
  FIntCVar::operator=(&deathmatch,iVar2);
  multiplayernext = true;
LAB_003a53e8:
  pcVar4 = FCommandLine::operator[](argv,1);
  G_DeferedInitNew(pcVar4,-1);
  return;
}

Assistant:

CCMD (map)
{
	if (netgame)
	{
		Printf ("Use " TEXTCOLOR_BOLD "changemap" TEXTCOLOR_NORMAL " instead. " TEXTCOLOR_BOLD "Map"
				TEXTCOLOR_NORMAL " is for single-player only.\n");
		return;
	}
	if (argv.argc() > 1)
	{
		try
		{
			if (!P_CheckMapData(argv[1]))
			{
				Printf ("No map %s\n", argv[1]);
			}
			else
			{
				if (argv.argc() > 2 && stricmp(argv[2], "coop") == 0)
				{
					deathmatch = false;
					multiplayernext = true;
				}
				else if (argv.argc() > 2 && stricmp(argv[2], "dm") == 0)
				{
					deathmatch = true;
					multiplayernext = true;
				}
				G_DeferedInitNew (argv[1]);
			}
		}
		catch(CRecoverableError &error)
		{
			if (error.GetMessage())
				Printf("%s", error.GetMessage());
		}
	}
	else
	{
		Printf ("Usage: map <map name> [coop|dm]\n");
	}
}